

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O2

void Aig_NodeUnionLists(Vec_Ptr_t *vArr1,Vec_Ptr_t *vArr2,Vec_Ptr_t *vArr)

{
  void **ppvVar1;
  void **ppvVar2;
  void *pvVar3;
  void *pvVar4;
  int iVar5;
  void **ppvVar6;
  void **ppvVar7;
  long lVar8;
  void **ppvVar9;
  void **ppvVar10;
  
  ppvVar9 = vArr1->pArray;
  ppvVar10 = vArr2->pArray;
  ppvVar2 = ppvVar9 + vArr1->nSize;
  ppvVar1 = ppvVar10 + vArr2->nSize;
  Vec_PtrGrow(vArr,vArr2->nSize + vArr1->nSize);
  ppvVar6 = vArr->pArray;
  ppvVar7 = ppvVar6;
  while ((ppvVar9 < ppvVar2 && (ppvVar10 < ppvVar1))) {
    pvVar3 = *ppvVar9;
    pvVar4 = *ppvVar10;
    iVar5 = *(int *)((long)pvVar4 + 0x24);
    if (*(int *)((long)pvVar3 + 0x24) == iVar5) {
      ppvVar9 = ppvVar9 + 1;
      *ppvVar7 = pvVar3;
      ppvVar10 = ppvVar10 + 1;
    }
    else if (*(int *)((long)pvVar3 + 0x24) < iVar5) {
      ppvVar9 = ppvVar9 + 1;
      *ppvVar7 = pvVar3;
    }
    else {
      ppvVar10 = ppvVar10 + 1;
      *ppvVar7 = pvVar4;
    }
    ppvVar7 = ppvVar7 + 1;
    ppvVar6 = ppvVar6 + 1;
  }
  for (; ppvVar9 < ppvVar2; ppvVar9 = ppvVar9 + 1) {
    *ppvVar7 = *ppvVar9;
    ppvVar7 = ppvVar7 + 1;
    ppvVar6 = ppvVar6 + 1;
  }
  for (lVar8 = 0; (void **)((long)ppvVar10 + lVar8) < ppvVar1; lVar8 = lVar8 + 8) {
    *(void **)((long)ppvVar7 + lVar8) = *(void **)((long)ppvVar10 + lVar8);
    ppvVar6 = ppvVar6 + 1;
  }
  iVar5 = (int)((ulong)((long)ppvVar6 - (long)vArr->pArray) >> 3);
  vArr->nSize = iVar5;
  if (vArr->nCap < iVar5) {
    __assert_fail("vArr->nSize <= vArr->nCap",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigUtil.c"
                  ,0x4e8,"void Aig_NodeUnionLists(Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  if (iVar5 < vArr1->nSize) {
    __assert_fail("vArr->nSize >= vArr1->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigUtil.c"
                  ,0x4e9,"void Aig_NodeUnionLists(Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  if (vArr2->nSize <= iVar5) {
    return;
  }
  __assert_fail("vArr->nSize >= vArr2->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigUtil.c"
                ,0x4ea,"void Aig_NodeUnionLists(Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
}

Assistant:

void Aig_NodeUnionLists( Vec_Ptr_t * vArr1, Vec_Ptr_t * vArr2, Vec_Ptr_t * vArr )
{
    Aig_Obj_t ** pBeg  = (Aig_Obj_t **)vArr->pArray;
    Aig_Obj_t ** pBeg1 = (Aig_Obj_t **)vArr1->pArray;
    Aig_Obj_t ** pBeg2 = (Aig_Obj_t **)vArr2->pArray;
    Aig_Obj_t ** pEnd1 = (Aig_Obj_t **)vArr1->pArray + vArr1->nSize;
    Aig_Obj_t ** pEnd2 = (Aig_Obj_t **)vArr2->pArray + vArr2->nSize;
    Vec_PtrGrow( vArr, Vec_PtrSize(vArr1) + Vec_PtrSize(vArr2) );
    pBeg  = (Aig_Obj_t **)vArr->pArray;
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( (*pBeg1)->Id == (*pBeg2)->Id )
            *pBeg++ = *pBeg1++, pBeg2++;
        else if ( (*pBeg1)->Id < (*pBeg2)->Id )
            *pBeg++ = *pBeg1++;
        else 
            *pBeg++ = *pBeg2++;
    }
    while ( pBeg1 < pEnd1 )
        *pBeg++ = *pBeg1++;
    while ( pBeg2 < pEnd2 )
        *pBeg++ = *pBeg2++;
    vArr->nSize = pBeg - (Aig_Obj_t **)vArr->pArray;
    assert( vArr->nSize <= vArr->nCap );
    assert( vArr->nSize >= vArr1->nSize );
    assert( vArr->nSize >= vArr2->nSize );
}